

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

void free_imm_response(void *client_data)

{
  int iVar1;
  int *in_RDI;
  response_instance_conflict resp;
  
  iVar1 = *in_RDI;
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      if (*(long *)(in_RDI + 6) != 0) {
        cod_code_free(*(undefined8 *)(in_RDI + 6));
      }
      if (*(long *)(in_RDI + 8) != 0) {
        cod_exec_context_free(*(undefined8 *)(in_RDI + 8));
      }
      goto LAB_0014be28;
    }
    if (iVar1 != 2) goto LAB_0014be28;
  }
  if (*(long *)(in_RDI + 6) != 0) {
    cod_code_free(*(undefined8 *)(in_RDI + 6));
  }
  if (*(long *)(in_RDI + 8) != 0) {
    cod_exec_context_free(*(undefined8 *)(in_RDI + 8));
  }
LAB_0014be28:
  free(in_RDI);
  return;
}

Assistant:

static void
free_imm_response(void *client_data)
{
    response_instance resp = (response_instance) client_data;
    switch (resp->response_type) {
    case Response_Filter:
    case Response_Router:
	if (resp->u.filter.code) cod_code_free(resp->u.filter.code);
	if (resp->u.filter.ec) cod_exec_context_free(resp->u.filter.ec);
	break;
    case Response_Transform:
	if (resp->u.transform.code) cod_code_free(resp->u.transform.code);
	if (resp->u.transform.ec) cod_exec_context_free(resp->u.transform.ec);
	break;
    default:
	break;
    }
    free(resp);
}